

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

SampledSpectrum
pbrt::ConnectBDPT(Integrator *integrator,SampledWavelengths *lambda,Vertex *lightVertices,
                 Vertex *cameraVertices,int s,int t,LightSamplerHandle lightSampler,
                 CameraHandle camera,SamplerHandle sampler,optional<pbrt::Point2<float>_> *pRaster,
                 Float *misWeightPtr)

{
  BSDF *this;
  Interaction *pIVar1;
  Vertex *pVVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Normal3<float> args;
  Vertex *pVVar5;
  Point3fi *pPVar6;
  Point3fi *pPVar7;
  anon_union_8_2_4c55fc14_for_EndpointInteraction_1 this_00;
  bool bVar8;
  CameraWiSample *pCVar9;
  CameraWiSample *pCVar10;
  CameraWiSample *pCVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  SampledLight *pSVar14;
  SurfaceInteraction *this_01;
  LightLiSample *pLVar15;
  LightLiSample *pLVar16;
  long lVar17;
  long lVar18;
  Normal3<float> *n;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  sampler_00;
  Normal3f *n_00;
  LightSampleContext *this_02;
  Vertex *this_03;
  long in_FS_OFFSET;
  type tVar19;
  Float FVar20;
  Point2f u;
  undefined1 auVar44 [56];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  ulong uVar65;
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  Vector3<float> VVar67;
  Point3f PVar68;
  SampledSpectrum SVar69;
  SampledSpectrum a;
  SampledSpectrum local_5a8;
  SampledWavelengths *local_598;
  DispatchSplit<9> local_589;
  Integrator *local_588;
  anon_union_8_2_4c55fc14_for_EndpointInteraction_1 local_580;
  LightSampleContext local_578;
  Vertex *local_548;
  undefined8 uStack_540;
  Float local_52c;
  Vertex *local_528;
  undefined8 uStack_520;
  CameraHandle local_510;
  undefined4 local_504;
  optional<pbrt::SampledLight> sampledLight;
  undefined1 local_4b8 [40];
  Tuple3<pbrt::Normal3,_float> aTStack_490 [2];
  MediumInterface *local_478;
  MediumHandle local_470;
  anon_union_8_2_4c55fc14_for_EndpointInteraction_1 local_468;
  SampledSpectrum local_458;
  undefined8 uStack_448;
  undefined8 uStack_440;
  LightSamplerHandle local_438;
  LightSamplerHandle local_430;
  undefined8 local_428;
  anon_union_8_2_4c55fc14_for_EndpointInteraction_1 local_420;
  optional<pbrt::CameraWiSample> cs;
  RNG rng;
  SampledSpectrum local_1f0;
  Vertex sampled;
  Interaction local_88;
  undefined1 auVar21 [16];
  undefined1 extraout_var [56];
  undefined1 auVar66 [56];
  
  auVar66 = in_ZMM1._8_56_;
  auVar44 = ZEXT856(0);
  local_598 = lambda;
  local_588 = integrator;
  SampledSpectrum::SampledSpectrum(&local_5a8,0.0);
  if ((s != 0 && 1 < t) && (cameraVertices[(ulong)(uint)t - 1].type == Light)) {
    SampledSpectrum::SampledSpectrum(&local_1f0,0.0);
    return (array<float,_4>)local_1f0.values.values;
  }
  Vertex::Vertex(&sampled);
  local_548 = cameraVertices;
  local_528 = lightVertices;
  if (s == 0) {
    bVar8 = Vertex::IsLight(cameraVertices + (long)t + -1);
    pVVar2 = local_548;
    if (bVar8) {
      SVar69 = Vertex::Le(cameraVertices + (long)t + -1,&local_588->infiniteLights,
                          local_548 + (long)t + -2,local_598);
      auVar52._0_8_ = SVar69.values.values._8_8_;
      auVar52._8_56_ = auVar66;
      auVar27._0_8_ = SVar69.values.values._0_8_;
      auVar27._8_56_ = auVar44;
      rng = (RNG)vmovlhps_avx(auVar27._0_16_,auVar52._0_16_);
      auVar44 = ZEXT856(rng.inc);
      SVar69 = SampledSpectrum::operator*((SampledSpectrum *)&rng,&pVVar2[(long)t + -1].beta);
      auVar53._0_8_ = SVar69.values.values._8_8_;
      auVar53._8_56_ = auVar66;
      auVar28._0_8_ = SVar69.values.values._0_8_;
      auVar28._8_56_ = auVar44;
      local_5a8.values.values = (array<float,_4>)vmovlhps_avx(auVar28._0_16_,auVar53._0_16_);
    }
    goto LAB_003d6f41;
  }
  if (t == 1) {
    bVar8 = Vertex::IsConnectible(lightVertices + (long)s + -1);
    pVVar2 = local_528;
    if (bVar8) {
      pVVar5 = local_528 + (long)s + -1;
      local_580 = (anon_union_8_2_4c55fc14_for_EndpointInteraction_1)(lightVertices + (long)s + -1);
      u = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
          ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                    ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                      *)sampler.
                        super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                        .bits);
      CameraHandle::SampleWi
                (&cs,(CameraHandle *)
                     camera.
                     super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                     .bits,&(pVVar5->field_2).ei.super_Interaction,u,local_598);
      if (cs.set == true) {
        pCVar9 = pstd::optional<pbrt::CameraWiSample>::value(&cs);
        this_00 = local_580;
        pstd::optional<pbrt::Point2<float>_>::operator=(pRaster,&pCVar9->pRaster);
        local_510.
        super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
        .bits = *(TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                  *)camera.
                    super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                    .bits;
        pCVar9 = pstd::optional<pbrt::CameraWiSample>::value(&cs);
        pCVar10 = pstd::optional<pbrt::CameraWiSample>::value(&cs);
        pCVar11 = pstd::optional<pbrt::CameraWiSample>::value(&cs);
        auVar44 = (undefined1  [56])0x0;
        SVar69 = SampledSpectrum::operator/(&pCVar10->Wi,pCVar11->pdf);
        auVar47._0_8_ = SVar69.values.values._8_8_;
        auVar47._8_56_ = auVar66;
        auVar22._0_8_ = SVar69.values.values._0_8_;
        auVar22._8_56_ = auVar44;
        local_4b8._0_16_ = vmovlhps_avx(auVar22._0_16_,auVar47._0_16_);
        auVar44 = ZEXT856(local_4b8._8_8_);
        Vertex::CreateCamera((Vertex *)&rng,&local_510,&pCVar9->pLens,(SampledSpectrum *)local_4b8);
        memcpy(&sampled,&rng,0x158);
        SVar69 = Vertex::f((Vertex *)this_00,&sampled,Importance);
        auVar48._0_8_ = SVar69.values.values._8_8_;
        auVar48._8_56_ = auVar66;
        auVar23._0_8_ = SVar69.values.values._0_8_;
        auVar23._8_56_ = auVar44;
        local_4b8._0_16_ = vmovlhps_avx(auVar23._0_16_,auVar48._0_16_);
        auVar44 = ZEXT856(local_4b8._8_8_);
        SVar69 = SampledSpectrum::operator*(&pVVar2[(long)s + -1].beta,(SampledSpectrum *)local_4b8)
        ;
        auVar49._0_8_ = SVar69.values.values._8_8_;
        auVar49._8_56_ = auVar66;
        auVar24._0_8_ = SVar69.values.values._0_8_;
        auVar24._8_56_ = auVar44;
        rng = (RNG)vmovlhps_avx(auVar24._0_16_,auVar49._0_16_);
        auVar44 = ZEXT856(rng.inc);
        SVar69 = SampledSpectrum::operator*((SampledSpectrum *)&rng,&sampled.beta);
        auVar50._0_8_ = SVar69.values.values._8_8_;
        auVar50._8_56_ = auVar66;
        uVar65 = auVar66._8_8_;
        auVar25._0_8_ = SVar69.values.values._0_8_;
        auVar25._8_56_ = auVar44;
        local_5a8.values.values = (array<float,_4>)vmovlhps_avx(auVar25._0_16_,auVar50._0_16_);
        bVar8 = Vertex::IsOnSurface((Vertex *)this_00);
        if (bVar8) {
          pCVar9 = pstd::optional<pbrt::CameraWiSample>::value(&cs);
          n = (Normal3<float> *)((long)this_00 + 0x40);
          if (*(int *)this_00 == 2) {
            n = (Normal3<float> *)((long)this_00 + 0x98);
          }
          tVar19 = AbsDot<float>(&pCVar9->wi,n);
          SampledSpectrum::operator*=(&local_5a8,tVar19);
        }
        bVar8 = SampledSpectrum::operator_cast_to_bool(&local_5a8);
        if (bVar8) {
          pCVar9 = pstd::optional<pbrt::CameraWiSample>::value(&cs);
          uVar12 = Hash<pbrt::Point2<float>>
                             ((Point2<float>)(pCVar9->pRaster).super_Tuple2<pbrt::Point2,_float>);
          pCVar9 = pstd::optional<pbrt::CameraWiSample>::value(&cs);
          local_88.mediumInterface = (pCVar9->pLens).mediumInterface;
          local_88.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
               (pCVar9->pLens).pi.super_Point3<pbrt::Interval>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
          local_88.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y =
               (pCVar9->pLens).pi.super_Point3<pbrt::Interval>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
          local_88.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
               (pCVar9->pLens).pi.super_Point3<pbrt::Interval>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
          local_88.time = (pCVar9->pLens).time;
          local_88.wo.super_Tuple3<pbrt::Vector3,_float>.x =
               (pCVar9->pLens).wo.super_Tuple3<pbrt::Vector3,_float>.x;
          local_88.wo.super_Tuple3<pbrt::Vector3,_float>.y =
               (pCVar9->pLens).wo.super_Tuple3<pbrt::Vector3,_float>.y;
          local_88.wo.super_Tuple3<pbrt::Vector3,_float>.z =
               (pCVar9->pLens).wo.super_Tuple3<pbrt::Vector3,_float>.z;
          local_88.n.super_Tuple3<pbrt::Normal3,_float>.x =
               (pCVar9->pLens).n.super_Tuple3<pbrt::Normal3,_float>.x;
          local_88.n.super_Tuple3<pbrt::Normal3,_float>.y =
               (pCVar9->pLens).n.super_Tuple3<pbrt::Normal3,_float>.y;
          local_88._48_8_ = *(undefined8 *)&(pCVar9->pLens).n.super_Tuple3<pbrt::Normal3,_float>.z;
          local_88._56_8_ = *(undefined8 *)&(pCVar9->pLens).uv.super_Tuple2<pbrt::Point2,_float>.y;
          local_88.medium.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                   )(pCVar9->pLens).medium.
                    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                    .bits;
          auVar44 = ZEXT856((ulong)local_88.pi.super_Point3<pbrt::Interval>.
                                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.y);
          auVar66 = ZEXT856(uVar65);
          uVar13 = Hash<pbrt::Interaction>(&local_88);
          RNG::SetSequence(&rng,uVar12,uVar13);
          pCVar9 = pstd::optional<pbrt::CameraWiSample>::value(&cs);
          pCVar10 = pstd::optional<pbrt::CameraWiSample>::value(&cs);
          SVar69 = Integrator::Tr(local_588,&pCVar9->pRef,&pCVar10->pLens,local_598,&rng);
          auVar51._0_8_ = SVar69.values.values._8_8_;
          auVar51._8_56_ = auVar66;
          auVar26._0_8_ = SVar69.values.values._0_8_;
          auVar26._8_56_ = auVar44;
          local_4b8._0_16_ = vmovlhps_avx(auVar26._0_16_,auVar51._0_16_);
          SampledSpectrum::operator*=(&local_5a8,(SampledSpectrum *)local_4b8);
        }
      }
      pstd::optional<pbrt::CameraWiSample>::~optional(&cs);
    }
    goto LAB_003d6f41;
  }
  if (s != 1) {
    pVVar2 = lightVertices + (long)s + -1;
    bVar8 = Vertex::IsConnectible(pVVar2);
    pVVar5 = local_548;
    if (bVar8) {
      this_03 = local_548 + (long)t + -1;
      bVar8 = Vertex::IsConnectible(this_03);
      if (bVar8) {
        SVar69 = Vertex::f(pVVar2,this_03,Importance);
        auVar54._0_8_ = SVar69.values.values._8_8_;
        auVar54._8_56_ = auVar66;
        auVar31._0_8_ = SVar69.values.values._0_8_;
        auVar31._8_56_ = auVar44;
        local_4b8._0_16_ = vmovlhps_avx(auVar31._0_16_,auVar54._0_16_);
        auVar44 = ZEXT856(local_4b8._8_8_);
        SVar69 = SampledSpectrum::operator*
                           (&lightVertices[(long)s + -1].beta,(SampledSpectrum *)local_4b8);
        auVar55._0_8_ = SVar69.values.values._8_8_;
        auVar55._8_56_ = auVar66;
        auVar32._0_8_ = SVar69.values.values._0_8_;
        auVar32._8_56_ = auVar44;
        cs.optionalValue._0_16_ = vmovlhps_avx(auVar32._0_16_,auVar55._0_16_);
        auVar44 = ZEXT856(cs.optionalValue._8_8_);
        SVar69 = Vertex::f(this_03,pVVar2,Radiance);
        auVar56._0_8_ = SVar69.values.values._8_8_;
        auVar56._8_56_ = auVar66;
        auVar33._0_8_ = SVar69.values.values._0_8_;
        auVar33._8_56_ = auVar44;
        local_578.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_
             = vmovlhps_avx(auVar33._0_16_,auVar56._0_16_);
        auVar44 = ZEXT856(local_578.pi.super_Point3<pbrt::Interval>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.y);
        SVar69 = SampledSpectrum::operator*((SampledSpectrum *)&cs,(SampledSpectrum *)&local_578);
        auVar57._0_8_ = SVar69.values.values._8_8_;
        auVar57._8_56_ = auVar66;
        auVar34._0_8_ = SVar69.values.values._0_8_;
        auVar34._8_56_ = auVar44;
        rng = (RNG)vmovlhps_avx(auVar34._0_16_,auVar57._0_16_);
        auVar44 = ZEXT856(rng.inc);
        sampler_00.bits = (uintptr_t)&pVVar5[(long)t + -1].beta;
        SVar69 = SampledSpectrum::operator*
                           ((SampledSpectrum *)&rng,(SampledSpectrum *)sampler_00.bits);
        auVar58._0_8_ = SVar69.values.values._8_8_;
        auVar58._8_56_ = auVar66;
        auVar35._0_8_ = SVar69.values.values._0_8_;
        auVar35._8_56_ = auVar44;
        local_5a8.values.values = (array<float,_4>)vmovlhps_avx(auVar35._0_16_,auVar58._0_16_);
        auVar44 = ZEXT856(local_5a8.values.values._8_8_);
        bVar8 = SampledSpectrum::operator_cast_to_bool(&local_5a8);
        if (bVar8) {
          SVar69 = G(local_588,(SamplerHandle)sampler_00.bits,pVVar2,this_03,local_598);
          auVar59._0_8_ = SVar69.values.values._8_8_;
          auVar59._8_56_ = auVar66;
          auVar36._0_8_ = SVar69.values.values._0_8_;
          auVar36._8_56_ = auVar44;
          rng = (RNG)vmovlhps_avx(auVar36._0_16_,auVar59._0_16_);
          SampledSpectrum::operator*=(&local_5a8,(SampledSpectrum *)&rng);
        }
      }
    }
    goto LAB_003d6f41;
  }
  pVVar2 = cameraVertices + (long)t + -1;
  bVar8 = Vertex::IsConnectible(pVVar2);
  if (!bVar8) goto LAB_003d6f41;
  FVar20 = TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
           ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                     ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                       *)sampler.
                         super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                         .bits);
  LightSamplerHandle::Sample
            (&sampledLight,
             (LightSamplerHandle *)
             lightSampler.
             super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
             .bits,FVar20);
  if (sampledLight.set == true) {
    pSVar14 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
    local_580.camera.
    super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
    .bits = (CameraHandle)
            (pSVar14->light).
            super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
            .bits;
    pSVar14 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
    pVVar5 = local_548;
    local_52c = pSVar14->pdf;
    bVar8 = Vertex::IsOnSurface(pVVar2);
    if (bVar8) {
      this_01 = Interaction::AsSurface(&pVVar5[(long)t + -1].field_2.ei.super_Interaction);
      local_578.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
           (this_01->super_Interaction).pi.super_Point3<pbrt::Interval>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
      this = &pVVar5[(long)t + -1].bsdf;
      pPVar6 = &(this_01->super_Interaction).pi;
      pPVar7 = &(this_01->super_Interaction).pi;
      local_578.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low =
           (pPVar6->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      local_578.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high =
           (pPVar6->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      local_578.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low =
           (pPVar7->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      local_578.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high =
           (pPVar7->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
      pPVar6 = &(this_01->super_Interaction).pi;
      pPVar7 = &(this_01->super_Interaction).pi;
      rng.state._0_4_ =
           (pPVar6->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      rng.state._4_4_ =
           (pPVar6->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      rng.inc._0_4_ =
           (pPVar7->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      rng.inc._4_4_ =
           (pPVar7->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
      local_578.n.super_Tuple3<pbrt::Normal3,_float>.z =
           (this_01->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
      local_578.n.super_Tuple3<pbrt::Normal3,_float>.x =
           (this_01->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
      local_578.n.super_Tuple3<pbrt::Normal3,_float>.y =
           (this_01->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
      uVar3 = (this_01->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
      uVar4 = (this_01->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
      local_578.ns.super_Tuple3<pbrt::Normal3,_float>.z =
           (this_01->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar44 = ZEXT856((ulong)(this_01->super_Interaction).pi.super_Point3<pbrt::Interval>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval>.y);
      local_578.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar3;
      local_578.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)uVar4;
      bVar8 = BSDF::HasReflection(this);
      if ((!bVar8) || (bVar8 = BSDF::HasTransmission(this), bVar8)) {
        bVar8 = BSDF::HasTransmission(this);
        if ((!bVar8) || (bVar8 = BSDF::HasReflection(this), bVar8)) goto LAB_003d6ba3;
        VVar67 = Tuple3<pbrt::Vector3,_float>::operator-
                           (&(this_01->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>);
        auVar29._0_8_ = VVar67.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar29._8_56_ = auVar44;
        uVar12 = vmovlps_avx(auVar29._0_16_);
        rng.inc._0_4_ = VVar67.super_Tuple3<pbrt::Vector3,_float>.z;
        rng.state = uVar12;
        PVar68 = Interaction::OffsetRayOrigin(&this_01->super_Interaction,(Vector3f *)&rng);
        fVar45 = PVar68.super_Tuple3<pbrt::Point3,_float>.z;
        auVar30._0_8_ = PVar68.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar30._8_56_ = auVar44;
        auVar21 = auVar30._0_16_;
      }
      else {
        PVar68 = Interaction::OffsetRayOrigin
                           (&this_01->super_Interaction,&(this_01->super_Interaction).wo);
        fVar45 = PVar68.super_Tuple3<pbrt::Point3,_float>.z;
        auVar37._0_8_ = PVar68.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar37._8_56_ = auVar44;
        auVar21 = auVar37._0_16_;
      }
      auVar46._4_4_ = fVar45;
      auVar46._0_4_ = fVar45;
      auVar46._8_4_ = fVar45;
      auVar46._12_4_ = fVar45;
      local_578.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_ =
           vshufps_avx(auVar21,auVar21,0x50);
      local_578.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
           (Interval)vmovlps_avx(auVar46);
    }
    else {
      local_578.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
           pVVar5[(long)t + -1].field_2.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
      local_578.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_ =
           *(undefined1 (*) [16])&pVVar5[(long)t + -1].field_2;
      rng = *(RNG *)&pVVar5[(long)t + -1].field_2;
      local_578.ns.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
      local_578.ns.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
      local_578.n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
      local_578.n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
      local_578.n.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
      local_578.ns.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
    }
LAB_003d6ba3:
    auVar21 = (undefined1  [16])
              local_578.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
              _0_16_;
    auVar38._0_8_ =
         TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
         ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                   ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                     *)sampler.
                       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                       .bits);
    auVar46 = (undefined1  [16])
              local_578.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
              _0_16_;
    auVar38._8_56_ = extraout_var;
    local_4b8._24_8_ = &local_504;
    local_458.values.values = *(array<float,_4> *)(local_598->lambda).values;
    uStack_448 = *(undefined8 *)(local_598->pdf).values;
    uStack_440 = *(undefined8 *)((local_598->pdf).values + 2);
    local_4b8._16_8_ = &local_458;
    local_4b8._8_8_ = &local_428;
    local_4b8._0_8_ = &rng;
    local_428 = vmovlps_avx(auVar38._0_16_);
    local_504 = 1;
    local_578.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
         auVar21._0_8_;
    local_578.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y =
         auVar21._8_8_;
    rng.state._0_4_ =
         local_578.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
    rng.state._4_4_ =
         local_578.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high
    ;
    rng.inc._0_4_ =
         local_578.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
    rng.inc._4_4_ =
         local_578.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high
    ;
    local_420 = local_580;
    local_578.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_ =
         auVar46;
    DispatchSplit<9>::operator()(&cs,&local_589,&local_420,(ulong)local_580 >> 0x30);
    if (cs.optionalValue.__data[0x70] == '\x01') {
      pLVar15 = pstd::optional<pbrt::LightLiSample>::value((optional<pbrt::LightLiSample> *)&cs);
      bVar8 = SampledSpectrum::operator_cast_to_bool(&pLVar15->L);
      if (bVar8) {
        pLVar15 = pstd::optional<pbrt::LightLiSample>::value((optional<pbrt::LightLiSample> *)&cs);
        uVar65 = 0;
        if (0.0 < pLVar15->pdf) {
          pLVar15 = pstd::optional<pbrt::LightLiSample>::value((optional<pbrt::LightLiSample> *)&cs)
          ;
          local_478 = (pLVar15->pLight).mediumInterface;
          pIVar1 = &pLVar15->pLight;
          local_4b8._0_4_ =
               (pIVar1->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
               x.low;
          local_4b8._4_4_ =
               (pIVar1->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
               x.high;
          local_4b8._8_4_ =
               (pIVar1->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
               y.low;
          local_4b8._12_4_ =
               (pIVar1->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
               y.high;
          local_4b8._16_8_ =
               (pLVar15->pLight).pi.super_Point3<pbrt::Interval>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
          local_4b8._24_8_ = *(undefined8 *)&(pLVar15->pLight).time;
          local_4b8._32_4_ = (pLVar15->pLight).wo.super_Tuple3<pbrt::Vector3,_float>.y;
          local_4b8._36_4_ = (pLVar15->pLight).wo.super_Tuple3<pbrt::Vector3,_float>.z;
          aTStack_490[0].x = (pLVar15->pLight).n.super_Tuple3<pbrt::Normal3,_float>.x;
          aTStack_490[0].y = (pLVar15->pLight).n.super_Tuple3<pbrt::Normal3,_float>.y;
          aTStack_490._8_8_ =
               *(undefined8 *)&(pLVar15->pLight).n.super_Tuple3<pbrt::Normal3,_float>.z;
          aTStack_490[1]._4_8_ =
               *(undefined8 *)&(pLVar15->pLight).uv.super_Tuple2<pbrt::Point2,_float>.y;
          local_470.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                   )(pLVar15->pLight).medium.
                    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                    .bits;
          local_468 = local_580;
          auVar66 = ZEXT856(uVar65);
          pLVar15 = pstd::optional<pbrt::LightLiSample>::value((optional<pbrt::LightLiSample> *)&cs)
          ;
          pLVar16 = pstd::optional<pbrt::LightLiSample>::value((optional<pbrt::LightLiSample> *)&cs)
          ;
          auVar44 = (undefined1  [56])0x0;
          SVar69 = SampledSpectrum::operator/(&pLVar15->L,local_52c * pLVar16->pdf);
          auVar60._0_8_ = SVar69.values.values._8_8_;
          auVar60._8_56_ = auVar66;
          auVar39._0_8_ = SVar69.values.values._0_8_;
          auVar39._8_56_ = auVar44;
          local_458.values.values = (array<float,_4>)vmovlhps_avx(auVar39._0_16_,auVar60._0_16_);
          Vertex::CreateLight((Vertex *)&rng,(EndpointInteraction *)local_4b8,&local_458,0.0);
          memcpy(&sampled,&rng,0x158);
          local_430.
          super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
          .bits = *(TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                    *)lightSampler.
                      super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                      .bits;
          sampled.pdfFwd =
               Vertex::PDFLightOrigin(&sampled,&local_588->infiniteLights,pVVar2,&local_430);
          auVar44 = extraout_var_00;
          SVar69 = Vertex::f(pVVar2,&sampled,Radiance);
          auVar61._0_8_ = SVar69.values.values._8_8_;
          auVar61._8_56_ = auVar66;
          auVar40._0_8_ = SVar69.values.values._0_8_;
          auVar40._8_56_ = auVar44;
          local_458.values.values = (array<float,_4>)vmovlhps_avx(auVar40._0_16_,auVar61._0_16_);
          auVar44 = ZEXT856(local_458.values.values._8_8_);
          SVar69 = SampledSpectrum::operator*(&pVVar5[(long)t + -1].beta,&local_458);
          auVar62._0_8_ = SVar69.values.values._8_8_;
          auVar62._8_56_ = auVar66;
          auVar41._0_8_ = SVar69.values.values._0_8_;
          auVar41._8_56_ = auVar44;
          rng = (RNG)vmovlhps_avx(auVar41._0_16_,auVar62._0_16_);
          auVar44 = ZEXT856(rng.inc);
          SVar69 = SampledSpectrum::operator*((SampledSpectrum *)&rng,&sampled.beta);
          auVar63._0_8_ = SVar69.values.values._8_8_;
          auVar63._8_56_ = auVar66;
          auVar42._0_8_ = SVar69.values.values._0_8_;
          auVar42._8_56_ = auVar44;
          local_5a8.values.values = (array<float,_4>)vmovlhps_avx(auVar42._0_16_,auVar63._0_16_);
          bVar8 = Vertex::IsOnSurface(pVVar2);
          if (bVar8) {
            pLVar15 = pstd::optional<pbrt::LightLiSample>::value
                                ((optional<pbrt::LightLiSample> *)&cs);
            n_00 = &(pVVar2->field_2).ei.super_Interaction.n;
            if (pVVar2->type == Surface) {
              n_00 = (Normal3f *)((pVVar2->field_2).mi.sigma_maj.values.values + 2);
            }
            tVar19 = AbsDot<float>(&pLVar15->wi,n_00);
            SampledSpectrum::operator*=(&local_5a8,tVar19);
          }
          bVar8 = SampledSpectrum::operator_cast_to_bool(&local_5a8);
          if (bVar8) {
            this_02 = &local_578;
            PVar68 = LightSampleContext::p(this_02);
            uVar12 = Hash<pbrt::Point3<float>>
                               ((pbrt *)this_02,
                                (Point3<float>)PVar68.super_Tuple3<pbrt::Point3,_float>);
            args.super_Tuple3<pbrt::Normal3,_float>.z =
                 local_578.n.super_Tuple3<pbrt::Normal3,_float>.z;
            args.super_Tuple3<pbrt::Normal3,_float>.x =
                 local_578.n.super_Tuple3<pbrt::Normal3,_float>.x;
            args.super_Tuple3<pbrt::Normal3,_float>.y =
                 local_578.n.super_Tuple3<pbrt::Normal3,_float>.y;
            auVar66 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
            auVar44 = (undefined1  [56])0x0;
            uVar13 = Hash<pbrt::Normal3<float>>((pbrt *)this_02,args);
            RNG::SetSequence(&rng,uVar12,uVar13);
            pLVar15 = pstd::optional<pbrt::LightLiSample>::value
                                ((optional<pbrt::LightLiSample> *)&cs);
            SVar69 = Integrator::Tr(local_588,&pVVar5[(long)t + -1].field_2.ei.super_Interaction,
                                    &pLVar15->pLight,local_598,&rng);
            auVar64._0_8_ = SVar69.values.values._8_8_;
            auVar64._8_56_ = auVar66;
            auVar43._0_8_ = SVar69.values.values._0_8_;
            auVar43._8_56_ = auVar44;
            local_458.values.values = (array<float,_4>)vmovlhps_avx(auVar43._0_16_,auVar64._0_16_);
            SampledSpectrum::operator*=(&local_5a8,&local_458);
          }
        }
      }
    }
    pstd::optional<pbrt::LightLiSample>::~optional((optional<pbrt::LightLiSample> *)&cs);
  }
  pstd::optional<pbrt::SampledLight>::~optional(&sampledLight);
LAB_003d6f41:
  *(long *)(in_FS_OFFSET + -0x278) = *(long *)(in_FS_OFFSET + -0x278) + 1;
  bVar8 = SampledSpectrum::operator_cast_to_bool(&local_5a8);
  if (!bVar8) {
    *(long *)(in_FS_OFFSET + -0x270) = *(long *)(in_FS_OFFSET + -0x270) + 1;
  }
  *(long *)(in_FS_OFFSET + -0x260) = *(long *)(in_FS_OFFSET + -0x260) + 1;
  lVar17 = (long)(s + -2 + t);
  *(long *)(in_FS_OFFSET + -0x268) = *(long *)(in_FS_OFFSET + -0x268) + lVar17;
  lVar18 = *(long *)(in_FS_OFFSET + -0x640);
  if (lVar17 <= *(long *)(in_FS_OFFSET + -0x640)) {
    lVar18 = lVar17;
  }
  if (lVar17 < *(long *)(in_FS_OFFSET + -0x638)) {
    lVar17 = *(long *)(in_FS_OFFSET + -0x638);
  }
  *(long *)(in_FS_OFFSET + -0x640) = lVar18;
  *(long *)(in_FS_OFFSET + -0x638) = lVar17;
  bVar8 = SampledSpectrum::operator_cast_to_bool(&local_5a8);
  FVar20 = 0.0;
  if (bVar8) {
    local_438.
    super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
    .bits = *(TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
              *)lightSampler.
                super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                .bits;
    FVar20 = MISWeight(local_588,local_528,local_548,&sampled,s,t,&local_438);
  }
  local_548 = (Vertex *)CONCAT44(local_548._4_4_,FVar20);
  SampledSpectrum::operator*=(&local_5a8,FVar20);
  if (misWeightPtr != (Float *)0x0) {
    *misWeightPtr = local_548._0_4_;
  }
  local_548 = (Vertex *)local_5a8.values.values._0_8_;
  uStack_540 = 0;
  local_528 = (Vertex *)local_5a8.values.values._8_8_;
  uStack_520 = 0;
  SVar69 = SampledWavelengths::PDF(local_598);
  a.values.values._8_8_ = local_528;
  a.values.values._0_8_ = local_548;
  SVar69 = SafeDiv(a,SVar69);
  return (array<float,_4>)(array<float,_4>)SVar69;
}

Assistant:

SampledSpectrum ConnectBDPT(const Integrator &integrator, SampledWavelengths &lambda,
                            Vertex *lightVertices, Vertex *cameraVertices, int s, int t,
                            LightSamplerHandle lightSampler, CameraHandle camera,
                            SamplerHandle sampler, pstd::optional<Point2f> *pRaster,
                            Float *misWeightPtr) {
    SampledSpectrum L(0.f);
    // Ignore invalid connections related to infinite area lights
    if (t > 1 && s != 0 && cameraVertices[t - 1].type == VertexType::Light)
        return SampledSpectrum(0.f);

    // Perform connection and write contribution to _L_
    Vertex sampled;
    if (s == 0) {
        // Interpret the camera subpath as a complete path
        const Vertex &pt = cameraVertices[t - 1];
        if (pt.IsLight())
            L = pt.Le(integrator.infiniteLights, cameraVertices[t - 2], lambda) * pt.beta;
        DCHECK(!L.HasNaNs());

    } else if (t == 1) {
        // Sample a point on the camera and connect it to the light subpath
        const Vertex &qs = lightVertices[s - 1];
        if (qs.IsConnectible()) {
            pstd::optional<CameraWiSample> cs =
                camera.SampleWi(qs.GetInteraction(), sampler.Get2D(), lambda);
            if (cs) {
                *pRaster = cs->pRaster;
                // Initialize dynamically sampled vertex and _L_ for $t=1$ case
                sampled = Vertex::CreateCamera(camera, cs->pLens, cs->Wi / cs->pdf);
                L = qs.beta * qs.f(sampled, TransportMode::Importance) * sampled.beta;
                if (qs.IsOnSurface())
                    L *= AbsDot(cs->wi, qs.ns());
                DCHECK(!L.HasNaNs());
                if (L) {
                    RNG rng(Hash(cs->pRaster), Hash(cs->pLens));
                    L *= integrator.Tr(cs->pRef, cs->pLens, lambda, rng);
                }
            }
        }

    } else if (s == 1) {
        // Sample a point on a light and connect it to the camera subpath
        const Vertex &pt = cameraVertices[t - 1];
        if (pt.IsConnectible()) {
            pstd::optional<SampledLight> sampledLight =
                lightSampler.Sample(sampler.Get1D());

            if (sampledLight) {
                LightHandle light = sampledLight->light;
                Float lightPDF = sampledLight->pdf;

                LightSampleContext ctx;
                if (pt.IsOnSurface()) {
                    const SurfaceInteraction &si = pt.GetInteraction().AsSurface();
                    ctx = LightSampleContext(si);
                    // Try to nudge the light sampling position to correct side of the
                    // surface
                    if (pt.bsdf.HasReflection() && !pt.bsdf.HasTransmission())
                        ctx.pi = si.OffsetRayOrigin(si.wo);
                    else if (pt.bsdf.HasTransmission() && !pt.bsdf.HasReflection())
                        ctx.pi = si.OffsetRayOrigin(-si.wo);
                } else
                    ctx = LightSampleContext(pt.GetInteraction());
                pstd::optional<LightLiSample> lightWeight =
                    light.SampleLi(ctx, sampler.Get2D(), lambda);
                if (lightWeight && lightWeight->L && lightWeight->pdf > 0) {
                    EndpointInteraction ei(light, lightWeight->pLight);
                    sampled = Vertex::CreateLight(
                        ei, lightWeight->L / (lightWeight->pdf * lightPDF), 0);
                    sampled.pdfFwd = sampled.PDFLightOrigin(integrator.infiniteLights, pt,
                                                            lightSampler);
                    L = pt.beta * pt.f(sampled, TransportMode::Radiance) * sampled.beta;
                    if (pt.IsOnSurface())
                        L *= AbsDot(lightWeight->wi, pt.ns());
                    // Only check visibility if the path would carry radiance.
                    if (L) {
                        RNG rng(Hash(ctx.p()), Hash(ctx.n));
                        L *= integrator.Tr(pt.GetInteraction(), lightWeight->pLight,
                                           lambda, rng);
                    }
                }
            }
        }

    } else {
        // Handle all other bidirectional connection cases
        const Vertex &qs = lightVertices[s - 1], &pt = cameraVertices[t - 1];
        if (qs.IsConnectible() && pt.IsConnectible()) {
            L = qs.beta * qs.f(pt, TransportMode::Importance) *
                pt.f(qs, TransportMode::Radiance) * pt.beta;
            PBRT_DBG("%s\n",
                     StringPrintf(
                         "General connect s: %d, t: %d, qs: %s, pt: %s, qs.f(pt): %s, "
                         "pt.f(qs): %s, G: %s, dist^2: %f",
                         s, t, qs, pt, qs.f(pt, TransportMode::Importance),
                         pt.f(qs, TransportMode::Radiance),
                         G(integrator, sampler, qs, pt, lambda),
                         DistanceSquared(qs.p(), pt.p()))
                         .c_str());
            if (L)
                L *= G(integrator, sampler, qs, pt, lambda);
        }
    }

    ++totalPaths;
    if (!L)
        ++zeroRadiancePaths;
    ReportValue(pathLength, s + t - 2);
    // Compute MIS weight for connection strategy
    Float misWeight = L ? MISWeight(integrator, lightVertices, cameraVertices, sampled, s,
                                    t, lightSampler)
                        : 0.f;
    PBRT_DBG("MIS weight for (s,t) = (%d, %d) connection: %f\n", s, t, misWeight);
    DCHECK(!IsNaN(misWeight));
    L *= misWeight;
    if (misWeightPtr != nullptr)
        *misWeightPtr = misWeight;

    return SafeDiv(L, lambda.PDF());
}